

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::IgnoreField(FieldDescriptor *field)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    puVar1 = *(undefined8 **)(*(long *)(field + 0x50) + 0x10);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            *puVar1,"net/proto2/proto/descriptor.proto");
    bVar3 = true;
    if (!bVar2) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              *puVar1,"google/protobuf/descriptor.proto");
      return bVar3;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IgnoreExtensionField(const FieldDescriptor* field) {
  // Exclude descriptor extensions from output "to avoid clutter" (from original
  // codegen).
  if (!field->is_extension()) return false;
  const FileDescriptor* file = field->containing_type()->file();
  return file->name() == "net/proto2/proto/descriptor.proto" ||
         file->name() == "google/protobuf/descriptor.proto";
}